

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__extend_receive(stbi__jpeg *j,int n)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  
  if (j->code_bits < n) {
    stbi__grow_buffer_unsafe(j);
  }
  if ((uint)n < 0x11) {
    uVar1 = j->code_buffer;
    bVar3 = (byte)n & 0x1f;
    uVar5 = uVar1 << bVar3 | uVar1 >> 0x20 - bVar3;
    uVar2 = stbi__bmask[(uint)n];
    j->code_buffer = ~uVar2 & uVar5;
    j->code_bits = j->code_bits - n;
    iVar4 = 0;
    if (-1 < (int)uVar1) {
      iVar4 = stbi__jbias[(uint)n];
    }
    return iVar4 + (uVar5 & uVar2);
  }
  __assert_fail("n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/stb/stb_image.h"
                ,0x7b6,"int stbi__extend_receive(stbi__jpeg *, int)");
}

Assistant:

stbi_inline static int stbi__extend_receive(stbi__jpeg *j, int n)
{
   unsigned int k;
   int sgn;
   if (j->code_bits < n) stbi__grow_buffer_unsafe(j);

   sgn = (stbi__int32)j->code_buffer >> 31; // sign bit is always in MSB
   k = stbi_lrot(j->code_buffer, n);
   STBI_ASSERT(n >= 0 && n < (int) (sizeof(stbi__bmask)/sizeof(*stbi__bmask)));
   j->code_buffer = k & ~stbi__bmask[n];
   k &= stbi__bmask[n];
   j->code_bits -= n;
   return k + (stbi__jbias[n] & ~sgn);
}